

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadCameraLibrary(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *pCamera;
  undefined4 extraout_var_00;
  string id;
  allocator local_51;
  key_type local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"camera");
        if (bVar1) {
          uVar3 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string
                    ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),&local_51);
          pCamera = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
                    ::operator[](&this->mCameraLibrary,&local_50);
          uVar3 = TestAttribute(this,"name");
          if (uVar3 != 0xffffffff) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)pCamera);
          }
          ReadCamera(this,pCamera);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_cameras");
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Expected end of <library_cameras> element.",&local_51);
      ThrowException(this,&local_50);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadCameraLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("camera"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                Camera& cam = mCameraLibrary[id];
                attrID = TestAttribute("name");
                if (attrID != -1)
                    cam.mName = mReader->getAttributeValue(attrID);

                ReadCamera(cam);

            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_cameras") != 0)
                ThrowException("Expected end of <library_cameras> element.");

            break;
        }
    }
}